

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

ImageT<unsigned_char,_3U> * __thiscall
ImageT<unsigned_char,_3U>::yflip(ImageT<unsigned_char,_3U> *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  Color *pCVar3;
  Color *pCVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  color<unsigned_char,_3U> *__dest;
  uint uVar8;
  ImageT<unsigned_char,_3U> *in_RDI;
  Color *dstRow;
  Color *srcRow;
  uint32_t dy;
  uint32_t sy;
  Color *rowBuffer;
  uint32_t rowSize;
  color<unsigned_char,_3U> *local_68;
  int local_2c;
  uint local_28;
  
  uVar8 = (in_RDI->super_Image).width * 3;
  uVar6 = CONCAT44(0,(in_RDI->super_Image).width);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar6;
  uVar7 = SUB168(auVar5 * ZEXT816(3),0);
  if (SUB168(auVar5 * ZEXT816(3),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  __dest = (color<unsigned_char,_3U> *)operator_new__(uVar7);
  if (uVar6 != 0) {
    local_68 = __dest;
    do {
      color<unsigned_char,_3U>::color(local_68);
      local_68 = local_68 + 1;
    } while (local_68 != __dest + uVar6);
  }
  local_28 = (in_RDI->super_Image).height;
  local_2c = 0;
  while (local_28 = local_28 - 1, (in_RDI->super_Image).height >> 1 <= local_28) {
    pCVar3 = in_RDI->pixels;
    uVar1 = (in_RDI->super_Image).width;
    pCVar4 = in_RDI->pixels;
    uVar2 = (in_RDI->super_Image).width;
    memcpy(__dest,pCVar4 + uVar2 * local_2c,(ulong)uVar8);
    memcpy(pCVar4 + uVar2 * local_2c,pCVar3 + uVar1 * local_28,(ulong)uVar8);
    memcpy(pCVar3 + uVar1 * local_28,__dest,(ulong)uVar8);
    local_2c = local_2c + 1;
  }
  if (__dest != (color<unsigned_char,_3U> *)0x0) {
    operator_delete__(__dest);
  }
  return in_RDI;
}

Assistant:

virtual ImageT& yflip() override {
        uint32_t rowSize = width * sizeof(Color);
        // Minimize memory use by only buffering a single row.
        Color* rowBuffer = new Color[width];

        for (uint32_t sy = height-1, dy = 0; sy >= height / 2; sy--, dy++) {
            Color* srcRow = &pixels[width * sy];
            Color* dstRow = &pixels[width * dy];

            memcpy(rowBuffer, dstRow, rowSize);
            memcpy(dstRow, srcRow, rowSize);
            memcpy(srcRow, rowBuffer, rowSize);
        }
        delete[] rowBuffer;
        return *this;
    }